

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildElementUnsigned1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot baseRegSlot,uint32 index,
          RegSlot regSlot)

{
  undefined1 *puVar1;
  undefined2 valueType;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  ValueType VVar5;
  RegOpnd *pRVar6;
  Instr *pIVar7;
  RegOpnd *pRVar8;
  undefined4 *puVar9;
  IndirOpnd *pIVar10;
  JitProfilingInstr *instr;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_00;
  Instr *pIVar11;
  undefined6 in_register_00000032;
  RegOpnd **ppRVar12;
  OpCode opcode;
  uint32 offset_00;
  Instr *pIVar13;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_52;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  RegSlot local_48;
  uint32 local_44;
  IRBuilder *local_40;
  uint32 local_38;
  char local_31;
  
  pIVar7 = (Instr *)(ulong)offset;
  local_48 = regSlot;
  local_44 = index;
  local_31 = Func::DoSimpleJitDynamicProfile(this->m_func);
  switch((int)CONCAT62(in_register_00000032,newOpcode)) {
  case 0x9e:
    local_38 = offset;
    pRVar8 = BuildSrcOpnd(this,baseRegSlot,TyVar);
    local_50.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_52.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_50.field_0,false);
    VVar5 = ValueType::SetArrayTypeId((ValueType *)&local_52.field_0,TypeIds_Array);
    IR::Opnd::SetValueType(&pRVar8->super_Opnd,VVar5);
    puVar1 = &(pRVar8->super_Opnd).field_0xb;
    *puVar1 = *puVar1 | 1;
    opcode = StElemI_A;
    if (local_31 != '\0') {
      opcode = StElemC;
    }
    break;
  case 0x9f:
switchD_004d36a1_caseD_9f:
    pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
    pRVar6 = BuildSrcOpnd(this,baseRegSlot,TyVar);
    local_4c.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_4e.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_4c.field_0,false);
    VVar5 = ValueType::SetArrayTypeId((ValueType *)&local_4e.field_0,TypeIds_Array);
    IR::Opnd::SetValueType(&pRVar6->super_Opnd,VVar5);
    puVar1 = &(pRVar6->super_Opnd).field_0xb;
    *puVar1 = *puVar1 | 1;
    pIVar7 = IR::Instr::New(LdArrHead,&pRVar8->super_Opnd,&pRVar6->super_Opnd,this->m_func);
    AddInstr(this,pIVar7,offset);
    local_38 = 0xffffffff;
    goto LAB_004d390a;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1731,"(false)","Unknown ElementUnsigned1 opcode");
    if (bVar4) {
      *puVar9 = 0;
      return;
    }
LAB_004d3aad:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  case 0xa1:
    local_40 = this;
    local_38 = offset;
    pRVar8 = BuildSrcOpnd(this,baseRegSlot,TyVar);
    pIVar11 = (pRVar8->m_sym->field_5).m_instrDef;
    if ((pIVar11 == (Instr *)0x0) || (pRVar6 = (RegOpnd *)pIVar11->m_dst, pRVar6 == (RegOpnd *)0x0))
    {
      pIVar11 = local_40->m_func->m_exitInstr->m_prev;
      this = (IRBuilder *)__tls_get_addr(&PTR_01548f08);
      if (pIVar11 != (Instr *)0x0) {
        pIVar13 = (Instr *)0x0;
        do {
          pIVar7 = pIVar11;
          if ((pIVar13 != (Instr *)0x0) && (pIVar13->m_prev != pIVar7)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            this->seenLdStackArgPtr = true;
            this->expectApplyArg = false;
            this->seenProfiledBeginSwitch = false;
            this->field_0x3 = 0;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1715,
                               "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == tmpInstr)"
                               ,"Modifying instr list but not using EDITING iterator!");
            if (!bVar4) goto LAB_004d3aad;
            this->seenLdStackArgPtr = false;
            this->expectApplyArg = false;
            this->seenProfiledBeginSwitch = false;
            this->field_0x3 = 0;
          }
          if (pIVar7->m_dst != (Opnd *)0x0) {
            ppRVar12 = (RegOpnd **)&pIVar7->m_dst;
            bVar4 = IR::Opnd::IsEqual(pIVar7->m_dst,&pRVar8->super_Opnd);
            pIVar11 = pIVar7;
            if (bVar4) {
LAB_004d397d:
              pRVar6 = *ppRVar12;
              if (pRVar6 != (RegOpnd *)0x0) goto LAB_004d398a;
              break;
            }
            if (pIVar7->m_opcode == StElemC) {
              pIVar11 = (Instr *)*ppRVar12;
              OVar3 = IR::Opnd::GetKind((Opnd *)pIVar11);
              if (OVar3 != OpndKindIndir) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                this->seenLdStackArgPtr = true;
                this->expectApplyArg = false;
                this->seenProfiledBeginSwitch = false;
                this->field_0x3 = 0;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
                if (!bVar4) goto LAB_004d3aad;
                this->seenLdStackArgPtr = false;
                this->expectApplyArg = false;
                this->seenProfiledBeginSwitch = false;
                this->field_0x3 = 0;
              }
              bVar4 = IR::Opnd::IsEqual((Opnd *)pIVar11->m_next,&pRVar8->super_Opnd);
              if (bVar4) {
                pIVar10 = IR::Opnd::AsIndirOpnd(&(*ppRVar12)->super_Opnd);
                ppRVar12 = &pIVar10->m_baseOpnd;
                goto LAB_004d397d;
              }
            }
          }
          pIVar11 = pIVar7->m_prev;
          pIVar13 = pIVar7;
        } while (pIVar11 != (Instr *)0x0);
      }
      offset = (uint32)pIVar7;
      baseRegSlot = (RegSlot)pIVar11;
      BuildElementUnsigned1(this);
      goto switchD_004d36a1_caseD_9f;
    }
LAB_004d398a:
    valueType = (pRVar6->super_Opnd).m_valueType;
    IR::Opnd::SetValueType(&pRVar8->super_Opnd,(ValueType)valueType);
    opcode = StElemC;
    this = local_40;
    break;
  case 0xa2:
    local_38 = offset;
    pRVar8 = BuildSrcOpnd(this,baseRegSlot,TyVar);
LAB_004d390a:
    opcode = StArrSegElemC;
  }
  local_40 = (IRBuilder *)pRVar8;
  pIVar10 = IR::IndirOpnd::New(pRVar8,local_44,TyVar,this->m_func,false);
  pRVar8 = BuildSrcOpnd(this,local_48,TyVar);
  if (local_31 == '\0') {
    if (opcode == StElemC) {
      local_4a = (((Opnd *)&local_40->seenLdStackArgPtr)->m_valueType).field_0;
      bVar4 = ValueType::IsUninitialized((ValueType *)&local_4a.field_0);
      offset_00 = local_38;
      if (!bVar4) {
        instr = (JitProfilingInstr *)
                IR::ProfiledInstr::New
                          (StElemC,&pIVar10->super_Opnd,&pRVar8->super_Opnd,this->m_func);
        this_00 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  new<Memory::JitArenaAllocator>(4,this->m_func->m_alloc,0x3eba5c);
        ValueType::ValueType((ValueType *)this_00);
        this_00[1].bits = Float;
        *this_00 = (((Opnd *)&local_40->seenLdStackArgPtr)->m_valueType).field_0;
        *(anon_union_2_4_ea848c7b_for_ValueType_13 **)&instr->profileId = this_00;
        goto LAB_004d3a90;
      }
    }
    offset_00 = local_38;
    instr = (JitProfilingInstr *)
            IR::Instr::New(opcode,&pIVar10->super_Opnd,&pRVar8->super_Opnd,this->m_func);
  }
  else {
    instr = IR::JitProfilingInstr::New(opcode,&pIVar10->super_Opnd,&pRVar8->super_Opnd,this->m_func)
    ;
    offset_00 = local_38;
  }
LAB_004d3a90:
  AddInstr(this,&instr->super_Instr,offset_00);
  return;
}

Assistant:

void
IRBuilder::BuildElementUnsigned1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot baseRegSlot, uint32 index, Js::RegSlot regSlot)
{
    // This is an array-style access with a constant (integer) index.
    // Embed the index in the indir opnd as a constant offset.

    IR::Instr *     instr;

    const bool simpleJit = m_func->DoSimpleJitDynamicProfile();

    IR::RegOpnd *   regOpnd;
    IR::IndirOpnd * indirOpnd;
    IR::RegOpnd * baseOpnd;
    Js::OpCode opcode;
    switch (newOpcode)
    {
    case Js::OpCode::StArrItemI_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot);

            // This instruction must not create missing values in the array
            baseOpnd->SetValueType(
                ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
            baseOpnd->SetValueTypeFixed();

            // In the case of simplejit, we won't know the exact type of array used until run time. Due to this,
            //    we must use the specialized version of StElemC in Lowering.
            opcode = simpleJit ? Js::OpCode::StElemC : Js::OpCode::StElemI_A;
            break;
        }

    case Js::OpCode::StArrItemC_CI4:
        {
            baseOpnd = IR::RegOpnd::New(TyVar, m_func);
            // Insert LdArrHead as the next instr and clear the offset to avoid duplication.
            IR::RegOpnd *const arrayOpnd = this->BuildSrcOpnd(baseRegSlot);

            // This instruction must not create missing values in the array
            arrayOpnd->SetValueType(
                ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
            arrayOpnd->SetValueTypeFixed();

            this->AddInstr(IR::Instr::New(Js::OpCode::LdArrHead, baseOpnd, arrayOpnd, m_func), offset);
            offset = Js::Constants::NoByteCodeOffset;
            opcode = Js::OpCode::StArrSegElemC;
            break;
        }
    case Js::OpCode::StArrSegItem_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot, TyVar);

            // This instruction must not create missing values in the array

            opcode = Js::OpCode::StArrSegElemC;
            break;
        }
    case Js::OpCode::StArrInlineItem_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot);

            IR::Opnd *defOpnd = baseOpnd->m_sym->m_instrDef ? baseOpnd->m_sym->m_instrDef->GetDst() : nullptr;
            if (!defOpnd)
            {
                // The array sym may be multi-def because of oddness in the renumbering of temps -- for instance,
                // if there's a loop increment expression whose result is unused (ExprGen only, probably).
                FOREACH_INSTR_BACKWARD(tmpInstr, m_func->m_exitInstr->m_prev)
                {
                    if (tmpInstr->GetDst())
                    {
                        if (tmpInstr->GetDst()->IsEqual(baseOpnd))
                        {
                            defOpnd = tmpInstr->GetDst();
                            break;
                        }
                        else if (tmpInstr->m_opcode == Js::OpCode::StElemC &&
                                 tmpInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->IsEqual(baseOpnd))
                        {
                            defOpnd = tmpInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
                            break;
                        }
                    }
                }
                NEXT_INSTR_BACKWARD;
            }
            AnalysisAssert(defOpnd);

            // This instruction must not create missing values in the array
            baseOpnd->SetValueType(defOpnd->GetValueType());

            opcode = Js::OpCode::StElemC;
            break;
        }
    default:
        AssertMsg(false, "Unknown ElementUnsigned1 opcode");
        return;

    }

    indirOpnd = this->BuildIndirOpnd(baseOpnd, index);
    regOpnd = this->BuildSrcOpnd(regSlot);
    if (simpleJit)
    {
        instr = IR::JitProfilingInstr::New(opcode, indirOpnd, regOpnd, m_func);
    }
    else if(opcode == Js::OpCode::StElemC && !baseOpnd->GetValueType().IsUninitialized())
    {
        // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the
        // ProfiledInstr.
        IR::ProfiledInstr *const profiledInstr = IR::ProfiledInstr::New(opcode, indirOpnd, regOpnd, m_func);
        Js::StElemInfo *const stElemInfo = JitAnew(m_func->m_alloc, Js::StElemInfo);
        stElemInfo->arrayType = baseOpnd->GetValueType();
        profiledInstr->u.stElemInfo = stElemInfo;
        instr = profiledInstr;
    }
    else
    {
        instr = IR::Instr::New(opcode, indirOpnd, regOpnd, m_func);
    }

    this->AddInstr(instr, offset);
}